

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham.h
# Opt level: O1

void __thiscall lzham_impl::unload(lzham_impl *this)

{
  (this->super_ilzham).lzham_decompress = (lzham_decompress_func)0x0;
  (this->super_ilzham).lzham_decompress_memory = (lzham_decompress_memory_func)0x0;
  (this->super_ilzham).lzham_decompress_init = (lzham_decompress_init_func)0x0;
  (this->super_ilzham).lzham_decompress_deinit = (lzham_decompress_deinit_func)0x0;
  (this->super_ilzham).lzham_compress = (lzham_compress_func)0x0;
  (this->super_ilzham).lzham_compress_memory = (lzham_compress_memory_func)0x0;
  (this->super_ilzham).lzham_compress_init = (lzham_compress_init_func)0x0;
  (this->super_ilzham).lzham_compress_deinit = (lzham_compress_deinit_func)0x0;
  (this->super_ilzham).lzham_get_version = (lzham_get_version_func)0x0;
  (this->super_ilzham).lzham_set_memory_callbacks = (lzham_set_memory_callbacks_func)0x0;
  return;
}

Assistant:

void clear()
   {
      lzham_get_version = NULL;
      lzham_set_memory_callbacks = NULL;
      lzham_compress_init = NULL;
      lzham_compress_deinit = NULL;
      lzham_compress = NULL;
      lzham_compress_memory = NULL;
      lzham_decompress_init = NULL;
      lzham_decompress_deinit = NULL;
      lzham_decompress = NULL;
      lzham_decompress_memory = NULL;
   }